

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O2

void __thiscall QGnomeThemePrivate::~QGnomeThemePrivate(QGnomeThemePrivate *this)

{
  QFont *pQVar1;
  
  (this->super_QGenericUnixThemePrivate).super_QPlatformThemePrivate._vptr_QPlatformThemePrivate =
       (_func_int **)&PTR__QGnomeThemePrivate_0078c958;
  pQVar1 = this->systemFont;
  if (pQVar1 != (QFont *)0x0) {
    QFont::~QFont(pQVar1);
    operator_delete(pQVar1,0x10);
  }
  pQVar1 = this->fixedFont;
  if (pQVar1 != (QFont *)0x0) {
    QFont::~QFont(pQVar1);
    operator_delete(pQVar1,0x10);
  }
  std::unique_ptr<QDBusPendingCallWatcher,_std::default_delete<QDBusPendingCallWatcher>_>::
  ~unique_ptr(&this->pendingCallWatcher);
  std::unique_ptr<QDBusListener,_std::default_delete<QDBusListener>_>::~unique_ptr(&this->dbus);
  QGenericUnixThemePrivate::~QGenericUnixThemePrivate(&this->super_QGenericUnixThemePrivate);
  return;
}

Assistant:

QGnomeThemePrivate::~QGnomeThemePrivate()
{
    if (systemFont)
        delete systemFont;
    if (fixedFont)
        delete fixedFont;
}